

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O2

BOOL __thiscall
Js::DynamicObject::CallToPrimitiveFunction
          (DynamicObject *this,Var toPrimitiveFunction,PropertyId propertyId,Var *result,
          ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  Type TVar2;
  ThreadContext *this_00;
  code *pcVar3;
  Var *ppvVar4;
  bool bVar5;
  Attributes attributes;
  BOOL BVar6;
  RecyclableObject *pRVar7;
  RecyclableObject *this_01;
  undefined4 *puVar8;
  anon_class_24_3_4fd9d492 local_58;
  Var *local_40;
  bool local_31;
  
  bVar5 = JavascriptConversion::IsCallable(toPrimitiveFunction);
  if (!bVar5) {
    return 0;
  }
  local_40 = result;
  pRVar7 = VarTo<Js::RecyclableObject>(toPrimitiveFunction);
  this_00 = requestContext->threadContext;
  local_31 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  local_58.this = this;
  local_58.threadContext = this_00;
  local_58.toStringFunction = pRVar7;
  attributes = FunctionInfo::GetAttributes(pRVar7);
  bVar5 = ThreadContext::HasNoSideEffect(this_00,pRVar7,attributes);
  if (bVar5) {
    pRVar7 = (RecyclableObject *)
             CallToPrimitiveFunction::anon_class_24_3_4fd9d492::operator()(&local_58);
    bVar5 = ThreadContext::IsOnStack(pRVar7);
LAB_00c3e39f:
    if (bVar5 != false) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_ToPrimitive;
    }
  }
  else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      pRVar7 = (RecyclableObject *)
               CallToPrimitiveFunction::anon_class_24_3_4fd9d492::operator()(&local_58);
      bVar5 = ThreadContext::IsOnStack(pRVar7);
      goto LAB_00c3e39f;
    }
    IVar1 = this_00->implicitCallFlags;
    pRVar7 = (RecyclableObject *)
             CallToPrimitiveFunction::anon_class_24_3_4fd9d492::operator()(&local_58);
    this_00->implicitCallFlags = IVar1 | ImplicitCall_ToPrimitive;
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_ToPrimitive;
    pRVar7 = (((((((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  ppvVar4 = local_40;
  this_00->reentrancySafeOrHandled = local_31;
  if (pRVar7 == (RecyclableObject *)0x0) {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x1d6,"(threadContext->IsDisableImplicitCall())",
                                  "threadContext->IsDisableImplicitCall()");
      if (!bVar5) goto LAB_00c3e5b3;
      *puVar8 = 0;
    }
    *ppvVar4 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).nullValue.ptr;
  }
  else {
    bVar5 = TaggedInt::Is(pRVar7);
    if ((ulong)pRVar7 >> 0x32 == 0 && !bVar5) {
      this_01 = UnsafeVarTo<Js::RecyclableObject>(pRVar7);
      if (this_01 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar5) goto LAB_00c3e5b3;
        *puVar8 = 0;
      }
      TVar2 = ((this_01->type).ptr)->typeId;
      if (0x57 < (int)TVar2) {
        BVar6 = RecyclableObject::IsExternal(this_01);
        if (BVar6 != 0) {
          return 0;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (bVar5) {
          *puVar8 = 0;
          return 0;
        }
LAB_00c3e5b3:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      if (9 < (int)TVar2) {
        return 0;
      }
    }
    *local_40 = pRVar7;
  }
  return 1;
}

Assistant:

BOOL DynamicObject::CallToPrimitiveFunction(Var toPrimitiveFunction, PropertyId propertyId, Var* result, ScriptContext * requestContext)
    {
        if (JavascriptConversion::IsCallable(toPrimitiveFunction))
        {
            RecyclableObject* toStringFunction = VarTo<RecyclableObject>(toPrimitiveFunction);

            ThreadContext * threadContext = requestContext->GetThreadContext();
            Var aResult = threadContext->ExecuteImplicitCall(toStringFunction, ImplicitCall_ToPrimitive, [=]() -> Js::Var
            {
                // Stack object should have a pre-op bail on implicit call.  We shouldn't see them here.
                Assert(!ThreadContext::IsOnStack(this) || threadContext->HasNoSideEffect(toStringFunction));
                return CALL_FUNCTION(threadContext, toStringFunction, CallInfo(CallFlags_Value, 1), this);
            });

            if (!aResult)
            {
                // There was an implicit call and implicit calls are disabled. This would typically cause a bailout.
                Assert(threadContext->IsDisableImplicitCall());
                *result = requestContext->GetLibrary()->GetNull();
                return true;
            }

            if (JavascriptOperators::GetTypeId(aResult) <= TypeIds_LastToPrimitiveType)
            {
                *result = aResult;
                return true;
            }
        }
        return false;
    }